

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

bool __thiscall flow::lang::Parser::consumeUntil(Parser *this,Token value)

{
  Token TVar1;
  Token value_local;
  Parser *this_local;
  
  while( true ) {
    TVar1 = token(this);
    if (TVar1 == value) {
      nextToken(this);
      return true;
    }
    TVar1 = token(this);
    if (TVar1 == Eof) break;
    nextToken(this);
  }
  return false;
}

Assistant:

bool Parser::consumeUntil(Token value) {
  for (;;) {
    if (token() == value) {
      nextToken();
      return true;
    }

    if (token() == Token::Eof) return false;

    nextToken();
  }
}